

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void hashkey(connectdata *conn,char *buf,size_t len)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  lVar2 = 0x120;
  if ((((uVar1 & 0x40) == 0) && (lVar2 = 0x160, (uVar1 & 0x20) == 0)) &&
     (lVar2 = 0x100, (uVar1 & 4) == 0)) {
    lVar2 = 0xd0;
  }
  curl_msnprintf(buf,0x80,"%ld%s",conn->port,
                 *(undefined8 *)((conn->chunk).hexbuffer + lVar2 + -0x20));
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len) /* something like 128 is fine */
{
  const char *hostname;

  if(conn->bits.socksproxy)
    hostname = conn->socks_proxy.host.name;
  else if(conn->bits.httpproxy)
    hostname = conn->http_proxy.host.name;
  else if(conn->bits.conn_to_host)
    hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  DEBUGASSERT(len > 32);

  /* put the number first so that the hostname gets cut off if too long */
  msnprintf(buf, len, "%ld%s", conn->port, hostname);
}